

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  uint32_t *puVar1;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  Variant *pVVar2;
  string *psVar3;
  uint *puVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ExecutionModel EVar9;
  uint32_t uVar10;
  uint uVar11;
  SPIRVariable *pSVar12;
  SPIRType *pSVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  SPIRConstant *pSVar14;
  Meta *pMVar15;
  mapped_type *pmVar16;
  mapped_type *this_01;
  SPIRExpression *pSVar17;
  runtime_error *this_02;
  size_t sVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  undefined4 in_register_00000014;
  long lVar19;
  long lVar20;
  uint32_t uVar21;
  ID id;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  TypeID *pTVar25;
  uint32_t index;
  AccessChainMeta meta;
  __node_gen_type __node_gen;
  string e;
  SmallVector<unsigned_int,_8UL> indices;
  uint local_150;
  uint local_14c;
  uint *local_148;
  undefined4 local_13c;
  SPIRVariable *local_138;
  uint local_12c;
  uint local_128;
  uint local_124;
  ulong local_120;
  AccessChainMeta local_118;
  SPIRType *local_108;
  uint32_t local_100;
  uint local_fc;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  SmallVector<unsigned_int,_8UL> local_b8;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_120 = CONCAT44(in_register_00000014,length);
  pSVar12 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  local_148 = ops;
  if (pSVar12 == (SPIRVariable *)0x0) {
    bVar7 = false;
    bVar6 = false;
    local_13c = 0;
    local_124 = 0;
    local_128 = 0;
  }
  else {
    pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
    bVar6 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(pSVar13->super_IVariant).self.id,DecorationBlock);
    sVar18 = (pSVar13->array).super_VectorView<unsigned_int>.buffer_size;
    local_138 = (SPIRVariable *)sVar18;
    bVar7 = variable_storage_requires_stage_io(this,pSVar12->storage);
    local_13c = (undefined4)CONCAT71(extraout_var,bVar7);
    bVar8 = Compiler::has_decoration((Compiler *)this,(ID)ops[2],DecorationPatch);
    bVar7 = true;
    local_128 = (uint)CONCAT71((int7)(sVar18 >> 8),1);
    if (!bVar8) {
      bVar8 = is_patch_block(this,pSVar13);
      local_128 = (uint)CONCAT71(extraout_var_00,bVar8);
    }
    if (pSVar12->storage != StorageClassInput) {
      if (pSVar12->storage == StorageClassOutput) {
        EVar9 = Compiler::get_execution_model((Compiler *)this);
        bVar7 = EVar9 == ExecutionModelTessellationControl;
      }
      else {
        bVar7 = false;
      }
    }
    if (((char)local_128 != '\0') &&
       ((!bVar6 || local_138 != (SPIRVariable *)0x0 || (pSVar12->storage == StorageClassInput)))) {
      bVar7 = false;
    }
    uVar23 = (pSVar12->super_IVariant).self.id;
    local_124 = CONCAT31((int3)(uVar23 >> 8),uVar23 != local_148[2]);
  }
  if ((!bVar7) ||
     ((bVar7 = Compiler::is_builtin_variable((Compiler *)this,pSVar12), bVar7 && bVar6 == false &&
      ((uVar10 = Compiler::get_decoration
                           ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,DecorationBuiltIn
                           ), 4 < uVar10 || (uVar10 == 2)))))) {
    if (pSVar12 == (SPIRVariable *)0x0) {
      id.id = 0;
    }
    else {
      id.id = (pSVar12->super_IVariant).self.id;
    }
    pMVar15 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,id);
    EVar9 = Compiler::get_execution_model((Compiler *)this);
    if (pSVar12 == (SPIRVariable *)0x0) {
      return false;
    }
    if (pMVar15 == (Meta *)0x0) {
      return false;
    }
    if (EVar9 == ExecutionModelTessellationControl) {
      if ((pMVar15->decoration).builtin_type != BuiltInTessLevelInner) {
        return false;
      }
      bVar7 = Compiler::is_tessellating_triangles((Compiler *)this);
      if (bVar7) {
        uVar22 = (ulong)local_148[3];
        if ((uVar22 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar22].type == TypeConstant
           )) {
          pSVar14 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar22);
        }
        else {
          pSVar14 = (SPIRConstant *)0x0;
        }
        puVar4 = local_148;
        if ((pSVar14 != (SPIRConstant *)0x0) && ((pSVar14->m).c[0].r[0].u32 == 1)) {
          return false;
        }
        pSVar12 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                            ((Compiler *)this,local_148[1],pSVar12);
        *(uint *)&(pSVar12->super_IVariant).field_0xc = *puVar4;
        this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
        local_b8.super_VectorView<unsigned_int>.ptr =
             (uint *)CONCAT44(local_b8.super_VectorView<unsigned_int>.ptr._4_4_,puVar4[2]);
        pmVar16 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)&local_b8);
        local_d8._M_dataplus._M_p._0_4_ = puVar4[1];
        this_01 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)&local_d8);
        Meta::operator=(this_01,pmVar16);
        Compiler::inherit_expression_dependencies((Compiler *)this,puVar4[1],puVar4[2]);
        return true;
      }
      return false;
    }
    return false;
  }
  uVar23 = local_128;
  cVar5 = (char)local_128;
  local_138 = pSVar12;
  if (pSVar12->storage == StorageClassOutput && (byte)local_124 == '\0') {
    if (bVar6 == false) {
      if (pSVar12 != (SPIRVariable *)0x0) {
        bVar7 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,pSVar12);
        goto LAB_0020e8ca;
      }
    }
    else {
      uVar11 = 4 - (local_128 & 0xff);
      if (uVar11 < (uint)local_120) {
        pSVar14 = Variant::get<spirv_cross::SPIRConstant>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_148[uVar11]);
        bVar7 = CompilerGLSL::is_stage_output_block_member_masked
                          (&this->super_CompilerGLSL,local_138,(pSVar14->m).c[0].r[0].u32,true);
LAB_0020e8ca:
        if (bVar7 != false) {
          return false;
        }
      }
    }
  }
  local_118.builtin = BuiltInPosition;
  local_118.storage_physical_type = 0;
  local_118.need_transpose = false;
  local_118.storage_is_packed = false;
  local_118.storage_is_invariant = false;
  local_118.flattened_struct = false;
  local_118.relaxed_precision = false;
  local_118.access_meshlet_position_y = false;
  local_118.chain_is_builtin = false;
  local_b8.super_VectorView<unsigned_int>.ptr = (uint *)&local_b8.stack_storage;
  local_b8.super_VectorView<unsigned_int>.buffer_size = 0;
  local_b8.buffer_capacity = 8;
  uVar10 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  SmallVector<unsigned_int,_8UL>::reserve(&local_b8,(ulong)((int)local_120 - 2));
  lVar19 = (ulong)(local_138->storage != StorageClassInput) * 4;
  lVar20 = lVar19 + 0x2be4;
  if (cVar5 != '\0') {
    lVar20 = lVar19 + 0x2bdc;
  }
  local_fc = *(uint *)((this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
                      lVar20 + -0x40);
  local_12c = local_fc;
  if ((byte)local_124 != '\0') {
    local_12c = local_148[2];
  }
  local_14c = 4 - ((local_124 & 0xff) + (uVar23 & 0xff));
  if ((byte)local_124 == '\0' && (char)local_128 == '\0') {
    uVar22 = (ulong)local_14c;
    SmallVector<unsigned_int,_8UL>::reserve
              (&local_b8,local_b8.super_VectorView<unsigned_int>.buffer_size + 1);
    *(uint *)((long)&((_Alloc_hider *)local_b8.super_VectorView<unsigned_int>.ptr)->_M_p +
             local_b8.super_VectorView<unsigned_int>.buffer_size * 4) = local_148[uVar22 - 1];
    local_b8.super_VectorView<unsigned_int>.buffer_size =
         local_b8.super_VectorView<unsigned_int>.buffer_size + 1;
  }
  puVar4 = local_148;
  local_108 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + *local_148);
  local_150 = Compiler::get_extended_decoration
                        ((Compiler *)this,puVar4[2],SPIRVCrossDecorationInterfaceMemberIndex);
  uVar22 = local_120;
  bVar7 = true;
  if (((byte)local_13c & (byte)local_124) == 1) {
    pSVar13 = Compiler::expression_type((Compiler *)this,local_12c);
    bVar8 = Compiler::is_array((Compiler *)this,pSVar13);
    if (!bVar8) {
      bVar7 = Compiler::is_matrix((Compiler *)this,pSVar13);
      bVar7 = bVar7 || pSVar13->basetype == Struct;
    }
  }
  if (((bVar6 | (byte)local_13c) == 1) && (bVar7)) {
    pSVar13 = Compiler::get_variable_element_type((Compiler *)this,local_138);
    uVar23 = (uint)uVar22;
    local_100 = uVar10;
    if ((local_150 == 0xffffffff) && (local_14c < uVar23)) {
      pSVar14 = Compiler::get_constant((Compiler *)this,(ConstantID)local_148[local_14c]);
      uVar11 = (pSVar14->m).c[0].r[0].u32;
      local_150 = Compiler::get_extended_member_decoration
                            ((Compiler *)this,(local_138->super_IVariant).self.id,uVar11,
                             SPIRVCrossDecorationInterfaceMemberIndex);
      if (local_150 == 0xffffffff) {
        __assert_fail("index != uint32_t(-1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x2224,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (pSVar13->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [uVar11].id);
      local_14c = local_14c + 1;
    }
    bVar6 = local_14c < uVar23;
    if (((byte)local_13c & bVar6) == 1) {
      uVar24 = (ulong)local_14c;
      local_78 = uVar22 & 0xffffffff;
      do {
        bVar8 = Compiler::is_array((Compiler *)this,pSVar13);
        if (((!bVar8) && (bVar8 = Compiler::is_matrix((Compiler *)this,pSVar13), !bVar8)) &&
           (pSVar13->basetype != Struct)) {
          local_14c = (uint)uVar24;
          break;
        }
        uVar22 = (ulong)local_148[uVar24];
        if ((uVar22 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar22].type == TypeConstant
           )) {
          pSVar14 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar22);
        }
        else {
          pSVar14 = (SPIRConstant *)0x0;
        }
        if ((pSVar14 == (SPIRConstant *)0x0) || (pSVar14->specialization == true)) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (this_02,
                     "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                    );
          *(undefined ***)this_02 = &PTR__runtime_error_0035fca8;
          __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((pSVar13->basetype == Struct) && (local_138->storage == StorageClassOutput)) {
          uVar10 = (pSVar14->m).c[0].r[0].u32;
          if (uVar10 != 0) {
            uVar21 = 0;
            do {
              bVar6 = CompilerGLSL::is_stage_output_block_member_masked
                                (&this->super_CompilerGLSL,local_138,uVar21,true);
              if (!bVar6) {
                local_150 = local_150 + 1;
              }
              uVar21 = uVar21 + 1;
            } while (uVar10 != uVar21);
          }
        }
        else {
          local_150 = local_150 + (pSVar14->m).c[0].r[0].u32;
        }
        uVar23 = (pSVar13->parent_type).id;
        if (uVar23 == 0) {
          if (pSVar13->basetype == Struct) {
            uVar23 = (pSVar13->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                     [(pSVar14->m).c[0].r[0].u32].id;
            goto LAB_0020ebdd;
          }
        }
        else {
LAB_0020ebdd:
          pSVar13 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar23);
        }
        uVar24 = uVar24 + 1;
        local_14c = local_14c + 1;
        bVar6 = uVar24 < local_78;
      } while (((byte)local_13c & bVar6) != 0);
    }
    pSVar13 = Compiler::get_pointee_type((Compiler *)this,local_108);
    uVar22 = local_120;
    uVar23 = (uint)local_120;
    if (((byte)local_13c == '\0') ||
       ((bVar8 = Compiler::is_matrix((Compiler *)this,pSVar13), !bVar8 &&
        (bVar8 = Compiler::is_array((Compiler *)this,pSVar13), !bVar8 && pSVar13->basetype != Struct
        )))) {
      local_d8._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
      uVar10 = local_100;
      local_f8._M_dataplus._M_p = local_f8._M_dataplus._M_p & 0xffffffffffffff00;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,local_100,(uint *)&local_d8,&local_150,(bool *)&local_f8);
      SmallVector<unsigned_int,_8UL>::reserve
                (&local_b8,local_b8.super_VectorView<unsigned_int>.buffer_size + 1);
      *(uint32_t *)
       ((long)&((_Alloc_hider *)local_b8.super_VectorView<unsigned_int>.ptr)->_M_p +
       local_b8.super_VectorView<unsigned_int>.buffer_size * 4) = uVar10;
      local_150 = 0xffffffff;
      sVar18 = local_b8.super_VectorView<unsigned_int>.buffer_size + 1;
      if (bVar6) {
        lVar20 = local_b8.super_VectorView<unsigned_int>.buffer_size * 4;
        local_b8.super_VectorView<unsigned_int>.buffer_size =
             local_b8.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::insert
                  (&local_b8,
                   (uint *)((long)&((_Alloc_hider *)local_b8.super_VectorView<unsigned_int>.ptr)->
                                   _M_p + lVar20 + 4),local_148 + local_14c,
                   local_148 + (uVar22 & 0xffffffff));
        sVar18 = local_b8.super_VectorView<unsigned_int>.buffer_size;
      }
    }
    else {
      sVar18 = local_b8.super_VectorView<unsigned_int>.buffer_size;
      if (local_14c != uVar23) {
        __assert_fail("i == length",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x2260,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
    }
    local_b8.super_VectorView<unsigned_int>.buffer_size = sVar18;
    if (local_150 == 0xffffffff) {
      Compiler::unset_extended_decoration
                ((Compiler *)this,local_148[1],SPIRVCrossDecorationInterfaceMemberIndex);
    }
    else {
      Compiler::set_extended_decoration
                ((Compiler *)this,local_148[1],SPIRVCrossDecorationInterfaceMemberIndex,local_150);
    }
  }
  else {
    if (local_150 != 0xffffffff) {
      uVar21 = get_uint_type_id(this);
      local_d8._M_dataplus._M_p._0_4_ = uVar21;
      local_f8._M_dataplus._M_p = local_f8._M_dataplus._M_p & 0xffffffffffffff00;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,uVar10,(uint *)&local_d8,&local_150,(bool *)&local_f8);
      SmallVector<unsigned_int,_8UL>::reserve
                (&local_b8,local_b8.super_VectorView<unsigned_int>.buffer_size + 1);
      *(uint32_t *)
       ((long)&((_Alloc_hider *)local_b8.super_VectorView<unsigned_int>.ptr)->_M_p +
       local_b8.super_VectorView<unsigned_int>.buffer_size * 4) = uVar10;
      local_b8.super_VectorView<unsigned_int>.buffer_size =
           local_b8.super_VectorView<unsigned_int>.buffer_size + 1;
    }
    puVar4 = local_148;
    local_150 = 0xffffffff;
    Compiler::unset_extended_decoration
              ((Compiler *)this,local_148[1],SPIRVCrossDecorationInterfaceMemberIndex);
    uVar23 = (uint)local_120;
    SmallVector<unsigned_int,_8UL>::insert
              (&local_b8,
               (uint *)((long)&((_Alloc_hider *)local_b8.super_VectorView<unsigned_int>.ptr)->_M_p +
                       local_b8.super_VectorView<unsigned_int>.buffer_size * 4),puVar4 + local_14c,
               puVar4 + (local_120 & 0xffffffff));
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  if ((byte)local_124 == '\0') {
    CompilerGLSL::access_chain_abi_cxx11_
              (&local_f8,&this->super_CompilerGLSL,local_12c,
               local_b8.super_VectorView<unsigned_int>.ptr,
               (uint32_t)local_b8.super_VectorView<unsigned_int>.buffer_size,local_108,&local_118,
               (bool)((byte)local_128 ^ 1));
  }
  else {
    uVar22 = (ulong)local_12c;
    if ((uVar22 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar22].type == TypeExpression))
    {
      pSVar17 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar22);
    }
    else {
      pSVar17 = (SPIRExpression *)0x0;
    }
    if (((char)local_13c == '\x01' && pSVar17 != (SPIRExpression *)0x0) &&
       (bVar7 && (pSVar17->implied_read_expressions).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 2)) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_12c,true);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_b8.super_VectorView<unsigned_int>.ptr;
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_fc,
                 local_b8.super_VectorView<unsigned_int>.ptr,
                 (uint32_t)local_b8.super_VectorView<unsigned_int>.buffer_size,2,&local_118);
      join<std::__cxx11::string,std::__cxx11::string>
                (&local_f8,(spirv_cross *)&local_50,&local_70,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      psVar3 = &local_50;
      goto LAB_0020f024;
    }
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_f8,&this->super_CompilerGLSL,local_12c,
               local_b8.super_VectorView<unsigned_int>.ptr,
               (uint32_t)local_b8.super_VectorView<unsigned_int>.buffer_size,0,&local_118);
  }
  ::std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
  psVar3 = &local_f8;
  local_50._M_dataplus._M_p = local_f8._M_dataplus._M_p;
LAB_0020f024:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &psVar3->field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pSVar13 = Compiler::get_variable_data_type((Compiler *)this,local_138);
  bVar7 = Compiler::has_extended_decoration
                    ((Compiler *)this,local_148[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
  if (bVar7) {
    uVar10 = Compiler::get_extended_decoration
                       ((Compiler *)this,local_148[2],SPIRVCrossDecorationTessIOOriginalInputTypeID)
    ;
    pSVar13 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar10);
  }
  if (3 < uVar23) {
    uVar22 = 3;
    do {
      bVar7 = Compiler::is_array((Compiler *)this,pSVar13);
      if ((bVar7) || (pSVar13->basetype != Struct)) {
        pTVar25 = &pSVar13->parent_type;
      }
      else {
        pSVar14 = Variant::get<spirv_cross::SPIRConstant>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_148[uVar22]);
        pTVar25 = (pSVar13->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr +
                  (pSVar14->m).c[0].r[0].u32;
      }
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + pTVar25->id);
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
  }
  bVar7 = Compiler::is_array((Compiler *)this,pSVar13);
  if ((((!bVar7) && (bVar7 = Compiler::is_matrix((Compiler *)this,pSVar13), !bVar7)) &&
      (pSVar13->basetype != Struct)) && (local_108->vecsize < pSVar13->vecsize)) {
    CompilerGLSL::vector_swizzle(local_108->vecsize,0);
    ::std::__cxx11::string::append((char *)&local_d8);
  }
  puVar4 = local_148;
  uVar10 = local_148[1];
  bVar7 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_148[2]);
  local_f8._M_dataplus._M_p._0_1_ = bVar7;
  pSVar17 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                      ((Compiler *)this,uVar10,&local_d8,puVar4,(bool *)&local_f8);
  puVar1 = puVar4 + 1;
  (pSVar17->loaded_from).id = (local_138->super_IVariant).self.id;
  pSVar17->need_transpose = local_118.need_transpose;
  pSVar17->access_chain = true;
  if (local_118.storage_is_packed == true) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  if (local_118.storage_physical_type != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypeID,
               local_118.storage_physical_type);
  }
  if (local_118.storage_is_invariant == true) {
    Compiler::set_decoration((Compiler *)this,(ID)*puVar1,DecorationInvariant,0);
  }
  Compiler::set_extended_decoration
            ((Compiler *)this,*puVar1,SPIRVCrossDecorationTessIOOriginalInputTypeID,
             (pSVar13->super_IVariant).self.id);
  local_138 = (SPIRVariable *)&(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries;
  local_f8._M_dataplus._M_p = (pointer)local_138;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_138,puVar1);
  local_f8._M_dataplus._M_p =
       (pointer)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_f8._M_dataplus._M_p,puVar1);
  puVar4 = local_148;
  if (2 < (uint)local_120) {
    uVar24 = local_120 & 0xffffffff;
    uVar22 = 2;
    do {
      Compiler::inherit_expression_dependencies((Compiler *)this,puVar4[1],puVar4[uVar22]);
      Compiler::add_implied_read_expression((Compiler *)this,pSVar17,puVar4[uVar22]);
      uVar22 = uVar22 + 1;
    } while (uVar24 != uVar22);
  }
  if ((pSVar17->expression_dependencies).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 0) {
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_138,puVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_b8.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_b8.super_VectorView<unsigned_int>.ptr !=
      &local_b8.stack_storage) {
    free(local_b8.super_VectorView<unsigned_int>.ptr);
  }
  return true;
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool flatten_composites = false;

	bool is_block = false;
	bool is_arrayed = false;

	if (var)
	{
		auto &type = get_variable_data_type(*var);
		is_block = has_decoration(type.self, DecorationBlock);
		is_arrayed = !type.array.empty();

		flatten_composites = variable_storage_requires_stage_io(var->storage);
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(type);

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput || (var->storage == StorageClassOutput && is_tesc_shader());

		// Patch inputs are treated as normal block IO variables, so they don't deal with this path at all.
		if (patch && (!is_block || is_arrayed || var->storage == StorageClassInput))
			flat_data = false;

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		// Also, skip ptr chain for patches.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	bool builtin_variable = false;
	bool variable_is_flat = false;

	if (var && flat_data)
	{
		builtin_variable = is_builtin_variable(*var);

		BuiltIn bi_type = BuiltInMax;
		if (builtin_variable && !is_block)
			bi_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

		variable_is_flat = !builtin_variable || is_block ||
		                   bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
		                   bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance;
	}

	if (variable_is_flat)
	{
		// If output is masked, it is emitted as a "normal" variable, just go through normal code paths.
		// Only check this for the first level of access chain.
		// Dealing with this for partial access chains should be possible, but awkward.
		if (var->storage == StorageClassOutput && !ptr_is_chain)
		{
			bool masked = false;
			if (is_block)
			{
				uint32_t relevant_member_index = patch ? 3 : 4;
				// FIXME: This won't work properly if the application first access chains into gl_out element,
				// then access chains into the member. Super weird, but theoretically possible ...
				if (length > relevant_member_index)
				{
					uint32_t mbr_idx = get<SPIRConstant>(ops[relevant_member_index]).scalar();
					masked = is_stage_output_block_member_masked(*var, mbr_idx, true);
				}
			}
			else if (var)
				masked = is_stage_output_variable_masked(*var);

			if (masked)
				return false;
		}

		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = (ptr_is_chain ? 3 : 4) - (patch ? 1 : 0);

		VariableID stage_var_id;
		if (patch)
			stage_var_id = var->storage == StorageClassInput ? patch_stage_in_var_id : patch_stage_out_var_id;
		else
			stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;

		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain && !patch)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[first_non_array_index - 1]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);

		// If we have a pointer chain expression, and we are no longer pointing to a composite
		// object, we are in the clear. There is no longer a need to flatten anything.
		bool further_access_chain_is_trivial = false;
		if (ptr_is_chain && flatten_composites)
		{
			auto &ptr_type = expression_type(ptr);
			if (!is_array(ptr_type) && !is_matrix(ptr_type) && ptr_type.basetype != SPIRType::Struct)
				further_access_chain_is_trivial = true;
		}

		if (!further_access_chain_is_trivial && (flatten_composites || is_block))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				uint32_t mbr_idx = get_constant(ops[first_non_array_index]).scalar();
				index = get_extended_member_decoration(var->self, mbr_idx,
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[mbr_idx]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; flatten_composites && i < length; ++i)
			{
				if (!is_array(*type) && !is_matrix(*type) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				if (type->basetype == SPIRType::Struct && var->storage == StorageClassOutput)
				{
					// Need to consider holes, since individual block members might be masked away.
					uint32_t mbr_idx = c->scalar();
					for (uint32_t j = 0; j < mbr_idx; j++)
						if (!is_stage_output_block_member_masked(*var, j, true))
							index++;
				}
				else
					index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			// We're not going to emit the actual member name, we let any further OpLoad take care of that.
			// Tag the access chain with the member index we're referencing.
			auto &result_pointee_type = get_pointee_type(result_ptr_type);
			bool defer_access_chain = flatten_composites && (is_matrix(result_pointee_type) || is_array(result_pointee_type) ||
			                                                 result_pointee_type.basetype == SPIRType::Struct);

			if (!defer_access_chain)
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Member index is now irrelevant.
				index = uint32_t(-1);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
			else
			{
				// We must have consumed the entire access chain if we're deferring it.
				assert(i == length);
			}

			if (index != uint32_t(-1))
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			else
				unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);
		}
		else
		{
			if (index != uint32_t(-1))
			{
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);
			}

			// Member index is now irrelevant.
			index = uint32_t(-1);
			unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);

			indices.insert(indices.end(), ops + first_non_array_index, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, !patch);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			bool split_access_chain_formulation = flatten_composites && ptr_expr &&
			                                      ptr_expr->implied_read_expressions.size() == 2 &&
			                                      !further_access_chain_is_trivial;

			if (split_access_chain_formulation)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], std::move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (is_tesc_shader() && var && m && m->decoration.builtin_type == BuiltInTessLevelInner &&
	    is_tessellating_triangles())
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}